

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O2

void Ses_ManCreateMainClause(Ses_Man_t *pSes,int t,int i,int j,int k,int a,int b,int c)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uStack_60;
  int pLits [5];
  
  iVar1 = Ses_ManSelectVar(pSes,i,j,k);
  pLits[0] = Abc_Var2Lit(iVar1,1);
  iVar1 = Ses_ManSimVar(pSes,i,t);
  pLits[1] = Abc_Var2Lit(iVar1,a);
  iVar1 = pSes->nSpecVars;
  if (j < iVar1) {
    if ((uint)((t + 1U >> (j & 0x1fU) & 1) != 0) != b) {
      return;
    }
    uStack_60 = 2;
  }
  else {
    iVar1 = Ses_ManSimVar(pSes,j - iVar1,t);
    pLits[2] = Abc_Var2Lit(iVar1,b);
    iVar1 = pSes->nSpecVars;
    uStack_60 = 3;
  }
  if (k < iVar1) {
    uVar2 = uStack_60;
    if ((uint)((t + 1U >> (k & 0x1fU) & 1) != 0) != c) {
      return;
    }
  }
  else {
    iVar1 = Ses_ManSimVar(pSes,k - iVar1,t);
    iVar1 = Abc_Var2Lit(iVar1,c);
    uVar2 = (ulong)((int)uStack_60 + 1);
    pLits[uStack_60] = iVar1;
  }
  uVar3 = uVar2;
  if (0 < b || 0 < c) {
    iVar1 = Ses_ManGateVar(pSes,i,b,c);
    iVar1 = Abc_Var2Lit(iVar1,1 - a);
    uVar3 = (ulong)((int)uVar2 + 1);
    pLits[uVar2] = iVar1;
  }
  sat_solver_addclause(pSes->pSat,pLits,pLits + uVar3);
  return;
}

Assistant:

static inline void Ses_ManCreateMainClause( Ses_Man_t * pSes, int t, int i, int j, int k, int a, int b, int c )
{
    int pLits[5], ctr = 0;

    pLits[ctr++] = Abc_Var2Lit( Ses_ManSelectVar( pSes, i, j, k ), 1 );
    pLits[ctr++] = Abc_Var2Lit( Ses_ManSimVar( pSes, i, t ), a );

    if ( j < pSes->nSpecVars )
    {
        if ( ( ( ( t + 1 ) & ( 1 << j ) ) ? 1 : 0 ) != b )
            return;
    }
    else
        pLits[ctr++] = Abc_Var2Lit( Ses_ManSimVar( pSes, j - pSes->nSpecVars, t ), b );

    if ( k < pSes->nSpecVars )
    {
        if ( ( ( ( t + 1 ) & ( 1 << k ) ) ? 1 : 0 ) != c )
            return;
    }
    else
        pLits[ctr++] = Abc_Var2Lit( Ses_ManSimVar( pSes, k - pSes->nSpecVars, t ), c );

    if ( b > 0 || c > 0 )
        pLits[ctr++] = Abc_Var2Lit( Ses_ManGateVar( pSes, i, b, c ), 1 - a );

    sat_solver_addclause( pSes->pSat, pLits, pLits + ctr );
}